

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O1

int cm_zlib_inflateSync(z_streamp strm)

{
  internal_state *piVar1;
  ulong uVar2;
  uLong uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  uLong uVar9;
  uchar buf [4];
  uchar local_34 [4];
  
  iVar4 = inflateStateCheck(strm);
  iVar8 = -2;
  if ((iVar4 == 0) &&
     ((piVar1 = strm->state, strm->avail_in != 0 || (iVar8 = -5, 7 < piVar1->w_mask)))) {
    if (piVar1->status != 0x3f53) {
      piVar1->status = 0x3f53;
      uVar2._0_4_ = piVar1->w_size;
      uVar2._4_4_ = piVar1->w_bits;
      uVar2 = uVar2 >> ((byte)piVar1->w_mask & 7);
      piVar1->w_size = (int)uVar2;
      piVar1->w_bits = (int)(uVar2 >> 0x20);
      uVar5 = piVar1->w_mask & 0xfffffff8;
      if (uVar5 == 0) {
        lVar7 = 0;
      }
      else {
        uVar6._0_4_ = piVar1->w_size;
        uVar6._4_4_ = piVar1->w_bits;
        lVar7 = 0;
        do {
          local_34[lVar7] = (uchar)uVar6;
          lVar7 = lVar7 + 1;
          uVar6 = uVar6 >> 8;
          uVar5 = uVar5 - 8;
        } while (uVar5 != 0);
        piVar1->w_size = (int)uVar6;
        piVar1->w_bits = (int)(uVar6 >> 0x20);
      }
      piVar1->w_mask = 0;
      piVar1->hash_mask = 0;
      syncsearch(&piVar1->hash_mask,local_34,(uint)lVar7);
    }
    uVar5 = syncsearch(&piVar1->hash_mask,strm->next_in,strm->avail_in);
    strm->avail_in = strm->avail_in - uVar5;
    strm->next_in = strm->next_in + uVar5;
    uVar9 = (ulong)uVar5 + strm->total_in;
    strm->total_in = uVar9;
    iVar8 = -3;
    if (piVar1->hash_mask == 4) {
      iVar4 = (int)piVar1->pending_buf_size;
      iVar8 = 0;
      uVar5 = 0;
      if (iVar4 != -1) {
        uVar5 = *(uint *)&piVar1->pending_buf & 0xfffffffb;
      }
      *(uint *)&piVar1->pending_buf = uVar5;
      uVar3 = strm->total_out;
      cm_zlib_inflateReset(strm);
      strm->total_in = uVar9;
      strm->total_out = uVar3;
      *(int *)&piVar1->pending_buf_size = iVar4;
      piVar1->status = 0x3f3f;
    }
  }
  return iVar8;
}

Assistant:

int ZEXPORT inflateSync(z_streamp strm) {
    unsigned len;               /* number of bytes to look at or looked at */
    int flags;                  /* temporary to save header status */
    unsigned long in, out;      /* temporary to save total_in and total_out */
    unsigned char buf[4];       /* to restore bit buffer to byte string */
    struct inflate_state FAR *state;

    /* check parameters */
    if (inflateStateCheck(strm)) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;
    if (strm->avail_in == 0 && state->bits < 8) return Z_BUF_ERROR;

    /* if first time, start search in bit buffer */
    if (state->mode != SYNC) {
        state->mode = SYNC;
        state->hold >>= state->bits & 7;
        state->bits -= state->bits & 7;
        len = 0;
        while (state->bits >= 8) {
            buf[len++] = (unsigned char)(state->hold);
            state->hold >>= 8;
            state->bits -= 8;
        }
        state->have = 0;
        syncsearch(&(state->have), buf, len);
    }

    /* search available input */
    len = syncsearch(&(state->have), strm->next_in, strm->avail_in);
    strm->avail_in -= len;
    strm->next_in += len;
    strm->total_in += len;

    /* return no joy or set up to restart inflate() on a new block */
    if (state->have != 4) return Z_DATA_ERROR;
    if (state->flags == -1)
        state->wrap = 0;    /* if no header yet, treat as raw */
    else
        state->wrap &= ~4;  /* no point in computing a check value now */
    flags = state->flags;
    in = strm->total_in;  out = strm->total_out;
    inflateReset(strm);
    strm->total_in = in;  strm->total_out = out;
    state->flags = flags;
    state->mode = TYPE;
    return Z_OK;
}